

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_join_mcast.c
# Opt level: O0

int os_fd_generic_join_mcast_recv
              (os_fd *sock,netaddr *multicast,os_interface *os_if,oonf_log_source log_src)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  char *pcVar5;
  bool bVar6;
  undefined8 in_stack_fffffffffffffde0;
  undefined4 uVar7;
  undefined8 in_stack_fffffffffffffde8;
  undefined4 uVar8;
  uint local_1d8;
  netaddr *pnStack_1a0;
  int if_index;
  netaddr *src;
  char *ifname;
  ipv6_mreq v6_mreq;
  ip_mreq v4_mreq;
  netaddr_str buf2;
  netaddr_str buf1;
  oonf_log_source log_src_local;
  os_interface *os_if_local;
  netaddr *multicast_local;
  os_fd *sock_local;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  src = (netaddr *)anon_var_dwarf_ff89;
  if (os_if != (os_interface *)0x0) {
    src = (netaddr *)os_if->name;
  }
  if (multicast->_type == '\x02') {
    if (os_if == (os_interface *)0x0) {
      pnStack_1a0 = &NETADDR_IPV4_ANY;
    }
    else {
      bVar6 = true;
      if (os_if->if_linklocal_v4 != (netaddr *)0x0) {
        bVar6 = os_if->if_linklocal_v4->_type == '\0';
      }
      if (bVar6) {
        pnStack_1a0 = os_if->if_v4;
      }
      else {
        pnStack_1a0 = os_if->if_linklocal_v4;
      }
    }
    if ((log_global_mask[log_src] & 1) != 0) {
      pcVar2 = netaddr_to_prefixstring((netaddr_str *)&v4_mreq,multicast,false);
      pcVar3 = netaddr_to_prefixstring((netaddr_str *)(buf2.buf + 0x36),pnStack_1a0,false);
      oonf_log(LOG_SEVERITY_DEBUG,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0x5d,
               (void *)0x0,0,"Socket on interface %s joining receiving multicast %s (src %s)\n",src,
               pcVar2,pcVar3);
    }
    netaddr_to_binary((void *)((long)&v6_mreq.ipv6mr_multiaddr.__in6_u + 0xc),multicast,4);
    netaddr_to_binary(&v6_mreq.ipv6mr_interface,pnStack_1a0,4);
    iVar1 = setsockopt(sock->fd,0,0x23,(void *)((long)&v6_mreq.ipv6mr_multiaddr.__in6_u + 0xc),8);
    if (iVar1 < 0) {
      if ((log_global_mask[log_src] & 4) != 0) {
        pcVar2 = netaddr_to_prefixstring((netaddr_str *)(buf2.buf + 0x36),multicast,false);
        pcVar3 = netaddr_to_prefixstring((netaddr_str *)&v4_mreq,pnStack_1a0,false);
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        piVar4 = __errno_location();
        oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",100,
                 (void *)0x0,0,"Cannot join multicast group %s (src %s) on interface %s: %s (%d)\n",
                 pcVar2,pcVar3,src,pcVar5,*piVar4);
      }
      return -1;
    }
  }
  else {
    if (os_if == (os_interface *)0x0) {
      local_1d8 = 0;
    }
    else {
      local_1d8 = os_if->index;
    }
    if ((log_global_mask[log_src] & 1) != 0) {
      pcVar2 = netaddr_to_prefixstring((netaddr_str *)&v4_mreq,multicast,false);
      oonf_log(LOG_SEVERITY_DEBUG,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0x6e,
               (void *)0x0,0,"Socket on interface %s joining receiving multicast %s (if %d)\n",src,
               pcVar2,CONCAT44(uVar7,local_1d8));
    }
    netaddr_to_binary((void *)((long)&ifname + 4),multicast,0x10);
    v6_mreq.ipv6mr_multiaddr.__in6_u.__u6_addr32[2] = local_1d8;
    iVar1 = setsockopt(sock->fd,0x29,0x14,(void *)((long)&ifname + 4),0x14);
    if (iVar1 < 0) {
      if ((log_global_mask[log_src] & 4) != 0) {
        pcVar2 = netaddr_to_prefixstring((netaddr_str *)(buf2.buf + 0x36),multicast,false);
        piVar4 = __errno_location();
        pcVar3 = strerror(*piVar4);
        piVar4 = __errno_location();
        oonf_log(LOG_SEVERITY_WARN,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0x75,
                 (void *)0x0,0,"Cannot join multicast group %s on interface %s: %s (%d)\n",pcVar2,
                 src,pcVar3,CONCAT44(uVar8,*piVar4));
      }
      return -1;
    }
  }
  return 0;
}

Assistant:

int
os_fd_generic_join_mcast_recv(struct os_fd *sock, const struct netaddr *multicast, const struct os_interface *os_if,
  enum oonf_log_source log_src __attribute__((unused))) {
  struct netaddr_str buf1, buf2;
  struct ip_mreq v4_mreq;
  struct ipv6_mreq v6_mreq;
  const char *ifname = "*";

  if (os_if) {
    ifname = os_if->name;
  }

  if (netaddr_get_address_family(multicast) == AF_INET) {
    const struct netaddr *src;

    if (os_if) {
      if (netaddr_is_unspec(os_if->if_linklocal_v4)) {
        src = os_if->if_v4;
      }
      else {
        src = os_if->if_linklocal_v4;
      }
    }
    else {
      src = &NETADDR_IPV4_ANY;
    }

    OONF_DEBUG(log_src, "Socket on interface %s joining receiving multicast %s (src %s)\n", ifname,
      netaddr_to_string(&buf2, multicast), netaddr_to_string(&buf1, src));

    netaddr_to_binary(&v4_mreq.imr_multiaddr, multicast, 4);
    netaddr_to_binary(&v4_mreq.imr_interface, src, 4);

    if (setsockopt(sock->fd, IPPROTO_IP, IP_ADD_MEMBERSHIP, &v4_mreq, sizeof(v4_mreq)) < 0) {
      OONF_WARN(log_src, "Cannot join multicast group %s (src %s) on interface %s: %s (%d)\n",
        netaddr_to_string(&buf1, multicast), netaddr_to_string(&buf2, src), ifname, strerror(errno), errno);
      return -1;
    }
  }
  else {
    int if_index;

    if_index = os_if == NULL ? 0 : os_if->index;

    OONF_DEBUG(log_src, "Socket on interface %s joining receiving multicast %s (if %d)\n", ifname,
      netaddr_to_string(&buf2, multicast), if_index);

    netaddr_to_binary(&v6_mreq.ipv6mr_multiaddr, multicast, 16);
    v6_mreq.ipv6mr_interface = if_index;

    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_JOIN_GROUP, &v6_mreq, sizeof(v6_mreq)) < 0) {
      OONF_WARN(log_src, "Cannot join multicast group %s on interface %s: %s (%d)\n",
        netaddr_to_string(&buf1, multicast), ifname, strerror(errno), errno);
      return -1;
    }
  }
  return 0;
}